

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

void trace_start(jit_State *J)

{
  uint8_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  TraceNo TVar4;
  undefined4 uVar5;
  lua_State *L;
  TValue *pTVar6;
  bool bVar7;
  int32_t iVar8;
  byte bVar9;
  ushort uVar10;
  ushort uVar11;
  IRRef1 IVar12;
  TRef TVar13;
  uint uVar14;
  TRef TVar15;
  TRef TVar16;
  GCRef *pGVar17;
  ptrdiff_t argbase;
  GCstr *pGVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  GCRef *pGVar22;
  GCproto *pGVar23;
  int iVar24;
  uint uVar25;
  ushort *puVar26;
  uint uVar27;
  uint uVar28;
  undefined1 *puVar29;
  IRIns *pIVar30;
  GCtrace *pGVar31;
  ulong uVar32;
  ulong uVar33;
  char cVar34;
  GCRef *pGVar35;
  ulong uVar36;
  long lVar37;
  SnapEntry *pSVar38;
  ulong uVar39;
  GCRef *pGVar40;
  undefined1 auVar41 [16];
  ulong local_78;
  
  if ((J->pt->flags & 8) != 0) {
    if (J->parent == 0) {
      *(char *)J->pc = (char)*J->pc + '\x01';
      puVar1 = &J->pt->flags;
      *puVar1 = *puVar1 | 0x10;
    }
    goto LAB_0012192a;
  }
  uVar25 = J->freetrace;
  if (uVar25 == 0) {
    J->freetrace = 1;
    uVar25 = 1;
  }
  uVar14 = J->sizetrace;
  if (uVar25 < uVar14) {
    pGVar17 = J->trace;
    uVar36 = (ulong)uVar25;
    iVar24 = uVar14 - uVar25;
    do {
      if (pGVar17[uVar36].gcptr32 == 0) {
        J->freetrace = (int)uVar36 + 1;
        goto LAB_00120f70;
      }
      uVar36 = uVar36 + 1;
      J->freetrace = (TraceNo)uVar36;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  uVar25 = J->param[0] + 1;
  if (0xfffe < uVar25) {
    uVar25 = 0xffff;
  }
  uVar27 = 2;
  if (2 < uVar25) {
    uVar27 = uVar25;
  }
  if (uVar27 <= uVar14) {
LAB_00121921:
    lj_trace_flushall(J->L);
LAB_0012192a:
    J->state = LJ_TRACE_IDLE;
    return;
  }
  uVar25 = 8;
  if (8 < uVar14 * 2) {
    uVar25 = uVar14 * 2;
  }
  if (uVar27 <= uVar25) {
    uVar25 = uVar27;
  }
  pGVar17 = (GCRef *)lj_mem_realloc(J->L,J->trace,uVar14 * 4,uVar25 * 4);
  J->sizetrace = uVar25;
  J->trace = pGVar17;
  if (uVar25 <= uVar14 + 1) {
    uVar25 = uVar14 + 1;
  }
  memset(pGVar17 + uVar14,0,(ulong)(~uVar14 + uVar25) * 4 + 4);
  uVar36 = (ulong)J->freetrace;
LAB_00120f70:
  if ((int)uVar36 == 0) goto LAB_00121921;
  pGVar17[uVar36 & 0xffffffff].gcptr32 = (uint32_t)J;
  (J->cur).traceno = 0;
  (J->cur).link = 0;
  (J->cur).root = 0;
  (J->cur).nextroot = 0;
  (J->cur).nextside = 0;
  (J->cur).sinktags = '\0';
  (J->cur).unused1 = '\0';
  *(undefined4 *)&(J->cur).field_0x5c = 0;
  (J->cur).ir = (IRIns *)0x0;
  (J->cur).nk = 0;
  (J->cur).nsnap = 0;
  (J->cur).nsnapmap = 0;
  (J->cur).nextgc = 0;
  (J->cur).marked = '\0';
  (J->cur).gct = '\0';
  (J->cur).topslot = '\0';
  (J->cur).linktype = '\0';
  (J->cur).nins = 0;
  (J->cur).gclist = 0;
  (J->cur).startpt = 0;
  (J->cur).startpc = 0;
  (J->cur).startins = 0;
  (J->cur).szmcode = 0;
  (J->cur).mcode = (MCode *)0x0;
  (J->cur).mcloop = 0;
  (J->cur).nchild = 0;
  (J->cur).spadjust = 0;
  (J->cur).traceno = (TraceNo1)uVar36;
  (J->cur).nk = 0x8000;
  (J->cur).nins = 0x8000;
  (J->cur).ir = J->irbuf;
  pSVar38 = J->snapmapbuf;
  (J->cur).snap = J->snapbuf;
  (J->cur).snapmap = pSVar38;
  cVar34 = '\0';
  J->postproc = LJ_POST_NONE;
  J->mergesnap = '\0';
  J->needsnap = '\0';
  J->guardemit = '\0';
  J->bcskip = '\0';
  (J->cur).startpt.gcptr32 = *(uint32_t *)&J->pt;
  L = J->L;
  if (((*(byte *)((ulong)(L->glref).ptr32 + 0x93) & 2) != 0) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE), argbase != 0)) {
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pGVar18 = lj_str_new(L,"start",5);
    (pTVar6->u32).lo = (uint32_t)pGVar18;
    (pTVar6->field_2).it = 0xfffffffb;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->n = (double)(int)uVar36;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    (pTVar6->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)&J->fn;
    (pTVar6->field_2).it = 0xfffffff7;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->n = (double)(int)((ulong)((long)J->pc + (-0x40 - (long)J->pt)) >> 2);
    TVar4 = J->parent;
    if (TVar4 != 0) {
      pTVar6 = L->top;
      L->top = pTVar6 + 1;
      pTVar6->n = (double)(int)TVar4;
      pTVar6 = L->top;
      L->top = pTVar6 + 1;
      pTVar6->n = (double)(int)J->exitno;
    }
    lj_vmevent_call(L,argbase);
  }
  J->bpropcache[0xe].key = 0;
  J->bpropcache[0xe].val = 0;
  J->bpropcache[0xe].mode = 0;
  J->bpropcache[0xf].key = 0;
  J->bpropcache[0xf].val = 0;
  J->bpropcache[0xf].mode = 0;
  J->bpropcache[0xc].key = 0;
  J->bpropcache[0xc].val = 0;
  J->bpropcache[0xc].mode = 0;
  J->bpropcache[0xd].key = 0;
  J->bpropcache[0xd].val = 0;
  J->bpropcache[0xd].mode = 0;
  J->bpropcache[10].key = 0;
  J->bpropcache[10].val = 0;
  J->bpropcache[10].mode = 0;
  J->bpropcache[0xb].key = 0;
  J->bpropcache[0xb].val = 0;
  J->bpropcache[0xb].mode = 0;
  J->bpropcache[8].key = 0;
  J->bpropcache[8].val = 0;
  J->bpropcache[8].mode = 0;
  J->bpropcache[9].key = 0;
  J->bpropcache[9].val = 0;
  J->bpropcache[9].mode = 0;
  J->bpropcache[6].key = 0;
  J->bpropcache[6].val = 0;
  J->bpropcache[6].mode = 0;
  J->bpropcache[7].key = 0;
  J->bpropcache[7].val = 0;
  J->bpropcache[7].mode = 0;
  J->bpropcache[4].key = 0;
  J->bpropcache[4].val = 0;
  J->bpropcache[4].mode = 0;
  J->bpropcache[5].key = 0;
  J->bpropcache[5].val = 0;
  J->bpropcache[5].mode = 0;
  J->bpropcache[2].key = 0;
  J->bpropcache[2].val = 0;
  J->bpropcache[2].mode = 0;
  J->bpropcache[3].key = 0;
  J->bpropcache[3].val = 0;
  J->bpropcache[3].mode = 0;
  J->bpropcache[0].key = 0;
  J->bpropcache[0].val = 0;
  J->bpropcache[0].mode = 0;
  J->bpropcache[1].key = 0;
  J->bpropcache[1].val = 0;
  J->bpropcache[1].mode = 0;
  memset(J->chain,0,0x4b8);
  (J->scev).idx = 0x7fff;
  (J->scev).pc.ptr32 = 0;
  J->base = J->slot + 1;
  J->maxslot = 0;
  J->baseslot = 1;
  J->retdepth = 0;
  iVar8 = J->param[9];
  J->instunroll = J->param[8];
  J->loopunroll = iVar8;
  J->tailcalled = 0;
  J->framedepth = 0;
  J->loopref = 0;
  J->bc_min = (BCIns *)0x0;
  J->bc_extent = 0xffffffff;
  (J->fold).ins.field_0.ot = 0xd05;
  uVar2 = J->parent;
  uVar3 = J->exitno;
  auVar41._4_4_ = uVar3;
  auVar41._0_4_ = uVar2;
  auVar41._8_8_ = 0;
  auVar41 = pshuflw(auVar41,auVar41,0xe8);
  (J->fold).ins.field_1.op12 = auVar41._0_4_;
  lj_ir_emit(J);
  lVar19 = 0;
  do {
    pIVar30 = (J->cur).ir;
    pIVar30[lVar19 + 0x7fff].field_1.op12 = 0;
    *(char *)((long)pIVar30 + lVar19 * 8 + 0x3fffc) = cVar34;
    *(undefined1 *)((long)pIVar30 + lVar19 * 8 + 0x3fffd) = 0x15;
    *(undefined2 *)((long)pIVar30 + lVar19 * 8 + 0x3fffe) = 0;
    lVar19 = lVar19 + -1;
    cVar34 = cVar34 + '\x01';
  } while (lVar19 != -3);
  (J->cur).nk = 0x7ffd;
  pGVar23 = (GCproto *)J->pc;
  J->startpc = (BCIns *)pGVar23;
  (J->cur).startpc.ptr32 = (uint32_t)pGVar23;
  uVar25 = J->parent;
  if ((ulong)uVar25 != 0) {
    uVar36 = (ulong)J->trace[uVar25].gcptr32;
    if (*(ushort *)(uVar36 + 0x54) != 0) {
      uVar25 = (uint)*(ushort *)(uVar36 + 0x54);
    }
    (J->cur).root = (TraceNo1)uVar25;
    (J->cur).startins = 0x54;
    uVar32 = (ulong)J->exitno;
    lVar19 = *(long *)(uVar36 + 0x20);
    if ((uVar32 == 0) && (*(char *)(lVar19 + 6) == '\0')) {
      if (((J->pt + 1 < pGVar23) && (uVar14 = pGVar23[-1].varinfo.ptr32, (char)uVar14 == 'J')) &&
         (*(ushort *)((long)pGVar23 + (ulong)(uVar14 >> 0x10) * 4 + -0x20002) == uVar25)) {
        lj_snap_add(J);
        rec_for_loop(J,J->pc + -1,&J->scev,1);
        goto LAB_00121a0c;
      }
    }
    else {
      J->startpc = (BCIns *)0x0;
    }
    pSVar38 = (SnapEntry *)((ulong)*(ushort *)(lVar19 + uVar32 * 8) * 4 + *(long *)(uVar36 + 0x28));
    bVar9 = *(byte *)(lVar19 + 6 + uVar32 * 8);
    J->framedepth = 0;
    uVar25 = (uint)bVar9;
    if (uVar25 != 0) {
      uVar20 = (ulong)uVar25;
      uVar39 = 0;
      local_78 = 0;
      bVar7 = false;
      do {
        uVar14 = pSVar38[uVar39];
        uVar28 = uVar14 >> 0x18;
        uVar27 = uVar14 & 0xffff;
        pIVar30 = (IRIns *)((ulong)(uVar27 * 8) + *(long *)(uVar36 + 0x10));
        uVar33 = 1L << ((byte)uVar14 & 0x3f);
        if ((uVar39 != 0) && ((uVar33 & local_78) != 0)) {
          uVar21 = 0;
          do {
            if ((pSVar38[uVar21] & 0xffff) == uVar27) {
              TVar13 = J->slot[pSVar38[uVar21] >> 0x18] & 0xfffcffff;
              if (TVar13 != 0) goto LAB_0012137e;
              break;
            }
            uVar21 = uVar21 + 1;
          } while (uVar39 != uVar21);
        }
        local_78 = local_78 | uVar33;
        if (uVar27 < 0x8000) {
          TVar13 = snap_replay_const(J,pIVar30);
        }
        else if (((pIVar30->field_0).prev & 0xff80) == 0x80) {
          bVar7 = true;
          TVar13 = uVar28;
        }
        else {
          uVar10 = 0x21;
          if ((pIVar30->field_1).o == 'E') {
            uVar10 = (pIVar30->field_0).op2 & 0x10 | 0x21;
          }
          (J->fold).ins.field_0.ot = (pIVar30->field_1).t.irt & 0x1f | 0x4500;
          *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar14 >> 0x18);
          (J->fold).ins.field_0.op2 = uVar10;
          TVar13 = lj_ir_emit(J);
        }
LAB_0012137e:
        J->slot[uVar28] = TVar13 | uVar14 & 0x30000;
        J->framedepth = J->framedepth + (uint)(0xffffff < uVar14 && (uVar14 & 0x30000) != 0);
        if ((uVar14 >> 0x10 & 1) != 0) {
          J->baseslot = uVar28 + 1;
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar20);
      if (bVar7) {
        puVar29 = (undefined1 *)
                  ((ulong)*(ushort *)(lVar19 + 2 + uVar32 * 8) * 8 + *(long *)(uVar36 + 0x10));
        uVar39 = 0;
        bVar7 = false;
        do {
          uVar14 = pSVar38[uVar39];
          pGVar31 = *(GCtrace **)(uVar36 + 0x10);
          pGVar17 = &pGVar31->nextgc + ((ulong)uVar14 & 0xffff) * 2;
          if (*(uint8_t *)((long)(pGVar17 + 1) + 2) == 0xfd) {
            if (J->slot[uVar14 >> 0x18] == uVar14 >> 0x18) {
              uVar10 = (ushort)pGVar17->gcptr32;
              uVar14 = *(uint *)(uVar36 + 0x18);
              if (uVar14 <= uVar10) {
                snap_pref(J,pGVar31,pSVar38,uVar25,local_78,(uint)uVar10);
                uVar14 = *(uint *)(uVar36 + 0x18);
              }
              uVar10 = *(ushort *)((long)&pGVar17->gcptr32 + 2);
              if (uVar14 <= uVar10) {
                snap_pref(J,*(GCtrace **)(uVar36 + 0x10),pSVar38,uVar25,local_78,(uint)uVar10);
              }
              bVar7 = true;
              pGVar35 = pGVar17;
              if (*(uint8_t *)((long)(pGVar17 + 1) + 1) != 'Q') {
LAB_00121495:
                pGVar40 = pGVar35;
                pGVar35 = pGVar40 + 2;
                if (pGVar35 < puVar29) {
                  if (*(char *)((long)&pGVar40[3].gcptr32 + 2) == -2) {
                    uVar33 = (ulong)*(byte *)((long)&pGVar40[3].gcptr32 + 3);
                    if (uVar33 == 0xff) {
                      uVar14 = *(byte *)((long)&pGVar40[3].gcptr32 + 1) - 0x47;
                      if ((4 < uVar14) || (uVar14 == 2)) goto LAB_00121495;
                      pGVar31 = *(GCtrace **)(uVar36 + 0x10);
                      pGVar22 = &pGVar31->nextgc + (ulong)(ushort)pGVar35->gcptr32 * 2;
                      if ((*(uint8_t *)((long)(pGVar22 + 1) + 1) & 0xfe) == 0x38) {
                        pGVar22 = &pGVar31->nextgc + (ulong)(ushort)pGVar22->gcptr32 * 2;
                      }
                      if (&pGVar31->nextgc + (ulong)(ushort)pGVar22->gcptr32 * 2 != pGVar17)
                      goto LAB_00121495;
                    }
                    else {
                      if (pGVar35 != pGVar17 + uVar33 * 2) goto LAB_00121495;
                      pGVar31 = *(GCtrace **)(uVar36 + 0x10);
                    }
                    TVar13 = snap_pref(J,pGVar31,pSVar38,uVar25,local_78,
                                       (uint)*(ushort *)((long)(pGVar40 + 2) + 2));
                    if (TVar13 == 0) {
                      snap_pref(J,*(GCtrace **)(uVar36 + 0x10),pSVar38,uVar25,local_78,
                                (uint)(ushort)(&(*(GCtrace **)(uVar36 + 0x10))->nextgc)
                                              [(ulong)*(ushort *)((long)(pGVar40 + 2) + 2) * 2].
                                              gcptr32);
                    }
                  }
                  goto LAB_00121495;
                }
              }
            }
          }
          else if ((0x7fff < (uint)((ulong)uVar14 & 0xffff)) &&
                  ((*(ushort *)((long)(pGVar17 + 1) + 2) & 0xff80) == 0x80)) {
            TVar13 = snap_pref(J,pGVar31,pSVar38,uVar25,local_78,(uint)(ushort)pGVar17->gcptr32);
            J->slot[uVar14 >> 0x18] = TVar13;
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar20);
        if (bVar7) {
          uVar39 = 0;
          do {
            uVar33 = (ulong)(pSVar38[uVar39] & 0xffff);
            pGVar31 = *(GCtrace **)(uVar36 + 0x10);
            if ((&pGVar31->topslot)[uVar33 * 8] == 0xfd) {
              uVar14 = pSVar38[uVar39] >> 0x18;
              if (J->slot[uVar14] == uVar14) {
                pGVar17 = &pGVar31->nextgc + uVar33 * 2;
                uVar10 = (ushort)pGVar17->gcptr32;
                uVar27 = *(uint *)(uVar36 + 0x18);
                if (uVar27 <= uVar10) {
                  TVar13 = snap_pref(J,pGVar31,pSVar38,uVar25,local_78,(uint)uVar10);
                  uVar10 = (ushort)TVar13;
                  uVar27 = *(uint *)(uVar36 + 0x18);
                }
                uVar11 = *(ushort *)((long)&pGVar17->gcptr32 + 2);
                if (uVar27 <= uVar11) {
                  TVar13 = snap_pref(J,*(GCtrace **)(uVar36 + 0x10),pSVar38,uVar25,local_78,
                                     (uint)uVar11);
                  uVar11 = (ushort)TVar13;
                }
                if (*(uint8_t *)((long)(pGVar17 + 1) + 1) != 'Q') {
                  (J->fold).ins.field_0.ot = *(ushort *)(pGVar17 + 1);
                  (J->fold).ins.field_0.op1 = uVar10;
                  (J->fold).ins.field_0.op2 = uVar11;
                  TVar13 = lj_opt_fold(J);
                  J->slot[uVar14] = TVar13;
                  pGVar35 = pGVar17;
LAB_001216ef:
                  pGVar40 = pGVar35 + 2;
                  if (pGVar40 < puVar29) {
                    if (*(char *)((long)&pGVar35[3].gcptr32 + 2) != -2) goto LAB_00121784;
                    uVar33 = (ulong)*(byte *)((long)&pGVar35[3].gcptr32 + 3);
                    if (uVar33 == 0xff) {
                      uVar14 = *(byte *)((long)&pGVar35[3].gcptr32 + 1) - 0x47;
                      if ((uVar14 < 5) && (uVar14 != 2)) {
                        lVar37 = *(long *)(uVar36 + 0x10);
                        uVar33 = (ulong)(ushort)pGVar40->gcptr32;
                        puVar26 = (ushort *)(uVar33 * 8 + lVar37);
                        bVar9 = *(byte *)((long)puVar26 + 5);
                        if ((bVar9 & 0xfe) == 0x38) {
                          puVar26 = (ushort *)((ulong)*puVar26 * 8 + lVar37);
                        }
                        if ((GCRef *)((ulong)*puVar26 * 8 + lVar37) == pGVar17) goto LAB_001217b1;
                      }
                      goto LAB_00121784;
                    }
                    if (pGVar40 != pGVar17 + uVar33 * 2) goto LAB_00121784;
                    lVar37 = *(long *)(uVar36 + 0x10);
                    uVar33 = (ulong)(ushort)pGVar40->gcptr32;
                    bVar9 = *(byte *)(lVar37 + 5 + uVar33 * 8);
LAB_001217b1:
                    uVar10 = *(ushort *)(lVar37 + 2 + uVar33 * 8);
                    IVar12 = (IRRef1)TVar13;
                    if (bVar9 != 0x3e) {
                      pIVar30 = (IRIns *)((ulong)uVar10 * 8 + lVar37);
                      if (bVar9 == 0x39) {
                        TVar15 = snap_replay_const(J,(IRIns *)((ulong)(pIVar30->field_0).op1 * 8 +
                                                              lVar37));
                        TVar15 = lj_ir_kslot(J,TVar15,(uint)(pIVar30->field_0).op2);
                        uVar10 = (ushort)TVar15;
                      }
                      else {
                        TVar15 = snap_replay_const(J,pIVar30);
                        uVar10 = (ushort)TVar15;
                      }
                      if ((*(byte *)(lVar37 + 5 + uVar33 * 8) & 0xfe) == 0x38) {
                        uVar5 = *(undefined4 *)
                                 (*(long *)(uVar36 + 0x10) + 2 +
                                 (ulong)*(ushort *)(lVar37 + uVar33 * 8) * 8);
                        (J->fold).ins.field_0.op1 = IVar12;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar5;
                        TVar15 = lj_opt_fold(J);
                        IVar12 = (IRRef1)TVar15;
                      }
                    }
                    (J->fold).ins.field_0.ot = *(IROpT *)(lVar37 + 4 + uVar33 * 8);
                    (J->fold).ins.field_0.op1 = IVar12;
                    (J->fold).ins.field_0.op2 = uVar10;
                    TVar15 = lj_opt_fold(J);
                    TVar16 = snap_pref(J,*(GCtrace **)(uVar36 + 0x10),pSVar38,uVar25,local_78,
                                       (uint)*(ushort *)((long)(pGVar35 + 2) + 2));
                    if (TVar16 == 0) {
                      TVar16 = snap_pref(J,*(GCtrace **)(uVar36 + 0x10),pSVar38,uVar25,local_78,
                                         (uint)(ushort)(&(*(GCtrace **)(uVar36 + 0x10))->nextgc)
                                                       [(ulong)*(ushort *)((long)(pGVar35 + 2) + 2)
                                                        * 2].gcptr32);
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
                      TVar16 = lj_opt_fold(J);
                    }
                    (J->fold).ins.field_0.ot = (IROpT)pGVar35[3].gcptr32;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
                    goto LAB_0012190b;
                  }
                  goto LAB_001216a9;
                }
                (J->fold).ins.field_0.ot = *(ushort *)(pGVar17 + 1) & 0xff9f;
                (J->fold).ins.field_0.op1 = uVar10;
                (J->fold).ins.field_0.op2 = uVar11;
                TVar13 = lj_opt_fold(J);
              }
              else {
                TVar13 = J->slot[J->slot[uVar14]];
              }
              J->slot[uVar14] = TVar13;
            }
LAB_001216a9:
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar20);
          J->base = J->slot + J->baseslot;
          J->maxslot = (uint)*(byte *)(lVar19 + 4 + uVar32 * 8) - J->baseslot;
          lj_snap_add(J);
          (J->fold).ins.field_0.ot = 0xf80;
          (J->fold).ins.field_1.op12 = 0;
          lj_ir_emit(J);
          goto LAB_00121a0c;
        }
      }
    }
    J->base = J->slot + J->baseslot;
    J->maxslot = (uint)*(byte *)(lVar19 + 4 + uVar32 * 8) - J->baseslot;
    lj_snap_add(J);
LAB_00121a0c:
    if (((int)(uint)*(ushort *)((ulong)J->trace[(J->cur).root].gcptr32 + 0x4c) < J->param[3]) &&
       ((int)(uint)*(byte *)(*(long *)(uVar36 + 0x20) + 7 + (ulong)J->exitno * 8) <
        J->param[7] + J->param[6])) {
      return;
    }
    rec_stop(J,LJ_TRLINK_INTERP,0);
    return;
  }
  (J->cur).root = 0;
  uVar25 = (pGVar23->nextgc).gcptr32;
  (J->cur).startins = uVar25;
  if (0xf < (uVar25 & 0xff) - 0x46) goto switchD_001219a8_caseD_49;
  uVar14 = uVar25 >> 8 & 0xff;
  switch(uVar25 & 0xff) {
  case 0x46:
  case 0x47:
  case 0x48:
    J->maxslot = ((uVar25 >> 0x10) + uVar14) - 1;
    break;
  case 0x4e:
    J->maxslot = (uVar14 + *(byte *)((long)&pGVar23[-1].varinfo.ptr32 + 3)) - 1;
  case 0x4b:
    uVar25 = uVar25 >> 0xe & 0xfffffffc;
    J->bc_extent = 0x20000 - uVar25;
    pGVar23 = (GCproto *)((long)pGVar23 + ((ulong)uVar25 - 0x1fffc));
    J->bc_min = (BCIns *)pGVar23;
    break;
  case 0x51:
    uVar27 = (&pGVar23[-0x800].nextgc)[uVar25 >> 0x10].gcptr32;
    if ((uVar27 & 0x800000ff) == 0x54) {
      uVar27 = uVar27 >> 0xe & 0xfffffffc;
      J->bc_min = (BCIns *)((long)pGVar23 + (ulong)uVar27 + (ulong)(uVar25 >> 0x10) * 4 + -0x3fffc);
      J->bc_extent = 0x20000 - uVar27;
    }
    J->maxslot = uVar14;
    goto LAB_00121b15;
  case 0x55:
    J->maxslot = (uint)J->pt->numparams;
LAB_00121b15:
    pGVar23 = (GCproto *)&pGVar23->marked;
  }
switchD_001219a8_caseD_49:
  J->pc = (BCIns *)pGVar23;
  lj_snap_add(J);
  if ((char)(J->cur).startins == 'K') {
    rec_for_loop(J,J->pc + -1,&J->scev,1);
  }
  if (J->pt->framesize < 0xf9) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
LAB_00121784:
  pGVar22 = pGVar35 + 3;
  pGVar35 = pGVar40;
  if ((*(char *)((long)&pGVar22->gcptr32 + 1) == 'T') &&
     (*(uint8_t *)((long)(pGVar17 + 1) + 1) == 'P')) {
    (J->fold).ins.field_0.ot = 0x5400;
    (J->fold).ins.field_1.op12 = 0;
LAB_0012190b:
    lj_opt_fold(J);
    pGVar35 = pGVar40;
  }
  goto LAB_001216ef;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lua_assert(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF);
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lua_assert((J2G(J)->hookmask & HOOK_GC) == 0);
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    }
  );
  lj_record_setup(J);
}